

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlUTF8Strsub(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlChar *val_00;
  size_t sVar3;
  xmlChar *val_01;
  int local_34;
  int n_len;
  int len;
  int n_start;
  int start;
  int n_utf;
  xmlChar *utf;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_start = 0; n_start < 5; n_start = n_start + 1) {
    for (n_len = 0; n_len < 4; n_len = n_len + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        val_00 = gen_const_xmlChar_ptr(n_start,0);
        iVar2 = gen_int(n_len,1);
        val = gen_int(local_34,2);
        if (((val_00 == (xmlChar *)0x0) || (sVar3 = strlen((char *)val_00), iVar2 <= (int)sVar3 + 1)
            ) && ((val_00 == (xmlChar *)0x0 ||
                  (sVar3 = strlen((char *)val_00), val <= (int)sVar3 + 1)))) {
          val_01 = (xmlChar *)xmlUTF8Strsub(val_00,iVar2,val);
          desret_xmlChar_ptr(val_01);
          call_tests = call_tests + 1;
          des_const_xmlChar_ptr(n_start,val_00,0);
          des_int(n_len,iVar2,1);
          des_int(local_34,val,2);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlUTF8Strsub",(ulong)(uint)(iVar2 - iVar1));
            ret_val._4_4_ = ret_val._4_4_ + 1;
            printf(" %d",(ulong)(uint)n_start);
            printf(" %d",(ulong)(uint)n_len);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlUTF8Strsub(void) {
    int test_ret = 0;

    int mem_base;
    xmlChar * ret_val;
    xmlChar * utf; /* a sequence of UTF-8 encoded bytes */
    int n_utf;
    int start; /* relative pos of first char */
    int n_start;
    int len; /* total number to copy */
    int n_len;

    for (n_utf = 0;n_utf < gen_nb_const_xmlChar_ptr;n_utf++) {
    for (n_start = 0;n_start < gen_nb_int;n_start++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        utf = gen_const_xmlChar_ptr(n_utf, 0);
        start = gen_int(n_start, 1);
        len = gen_int(n_len, 2);
        if ((utf != NULL) &&
            (start > (int) strlen((const char *) utf) + 1))
            continue;
        if ((utf != NULL) &&
            (len > (int) strlen((const char *) utf) + 1))
            continue;

        ret_val = xmlUTF8Strsub((const xmlChar *)utf, start, len);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_utf, (const xmlChar *)utf, 0);
        des_int(n_start, start, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlUTF8Strsub",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_utf);
            printf(" %d", n_start);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}